

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall
GEO::Delaunay3dThread::StellateConflictStack::push
          (StellateConflictStack *this,index_t t1,index_t t1fbord,index_t t1fprev)

{
  size_type sVar1;
  Frame *pFVar2;
  index_t t1fprev_local;
  index_t t1fbord_local;
  index_t t1_local;
  StellateConflictStack *this_local;
  
  sVar1 = std::
          vector<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
          ::size(&this->store_);
  std::
  vector<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
  ::resize(&this->store_,sVar1 + 1);
  pFVar2 = top(this);
  pFVar2->t1 = t1;
  pFVar2 = top(this);
  pFVar2->t1fbord = (uint8)t1fbord;
  pFVar2 = top(this);
  pFVar2->t1fprev = (uint8)t1fprev;
  return;
}

Assistant:

void push(index_t t1, index_t t1fbord, index_t t1fprev) {
                store_.resize(store_.size()+1);
                top().t1 = t1;
                top().t1fbord = Numeric::uint8(t1fbord);
                top().t1fprev = Numeric::uint8(t1fprev);
            }